

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O1

Result * CoreML::validateInt8Requirements
                   (Result *__return_storage_ptr__,WeightParams *weights,string *layerType,
                   string *layerName)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  undefined1 *puVar6;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  uint uVar10;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = (weights->floatvalue_).current_size_;
  lVar2 = *(long *)(((ulong)(weights->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar10 = (0 < iVar1) + 1;
  if (lVar2 == 0) {
    uVar10 = (uint)(0 < iVar1);
  }
  lVar3 = *(long *)(((ulong)(weights->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  lVar4 = *(long *)(((ulong)(weights->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar10 = (uVar10 - (lVar3 == 0)) + 2;
  if ((((uVar10 - (lVar4 == 0) < 2) && (lVar2 == 0)) && (uVar10 != (lVar4 == 0))) && (iVar1 < 1)) {
    if (lVar3 == 0) {
      if (lVar4 != 0) {
LAB_00379cab:
        if ((weights != (WeightParams *)Specification::_WeightParams_default_instance_) &&
           (weights->quantization_ != (QuantizationParams *)0x0)) {
          puVar6 = (undefined1 *)weights->quantization_;
          if ((QuantizationParams *)puVar6 == (QuantizationParams *)0x0) {
            puVar6 = Specification::_QuantizationParams_default_instance_;
          }
          if (((QuantizationParams *)puVar6)->numberofbits_ == 8) {
            if (((QuantizationParams *)puVar6)->_oneof_case_[0] == 0x65) {
              if ((((((QuantizationParams *)puVar6)->QuantizationType_).linearquantization_)->scale_
                  ).current_size_ == 1) {
                if ((((((QuantizationParams *)puVar6)->QuantizationType_).linearquantization_)->
                    bias_).current_size_ == 0) {
                  Result::Result(__return_storage_ptr__);
                  return __return_storage_ptr__;
                }
                std::operator+(&local_40,"Layer \'",layerName);
                puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_40);
                local_a0 = &local_90;
                plVar5 = puVar7 + 2;
                if ((long *)*puVar7 == plVar5) {
                  local_90 = *plVar5;
                  lStack_88 = puVar7[3];
                }
                else {
                  local_90 = *plVar5;
                  local_a0 = (long *)*puVar7;
                }
                local_98 = puVar7[1];
                *puVar7 = plVar5;
                puVar7[1] = 0;
                *(undefined1 *)(puVar7 + 2) = 0;
                puVar7 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_a0,(ulong)(layerType->_M_dataplus)._M_p);
                local_80 = &local_70;
                plVar5 = puVar7 + 2;
                if ((long *)*puVar7 == plVar5) {
                  local_70 = *plVar5;
                  lStack_68 = puVar7[3];
                }
                else {
                  local_70 = *plVar5;
                  local_80 = (long *)*puVar7;
                }
                local_78 = puVar7[1];
                *puVar7 = plVar5;
                puVar7[1] = 0;
                *(undefined1 *)(puVar7 + 2) = 0;
                plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
                local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                psVar9 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar9) {
                  local_60.field_2._M_allocated_capacity = *psVar9;
                  local_60.field_2._8_8_ = plVar5[3];
                }
                else {
                  local_60.field_2._M_allocated_capacity = *psVar9;
                  local_60._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_60._M_string_length = plVar5[1];
                *plVar5 = (long)psVar9;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
              }
              else {
                std::operator+(&local_40,"Layer \'",layerName);
                puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_40);
                local_a0 = &local_90;
                plVar5 = puVar7 + 2;
                if ((long *)*puVar7 == plVar5) {
                  local_90 = *plVar5;
                  lStack_88 = puVar7[3];
                }
                else {
                  local_90 = *plVar5;
                  local_a0 = (long *)*puVar7;
                }
                local_98 = puVar7[1];
                *puVar7 = plVar5;
                puVar7[1] = 0;
                *(undefined1 *)(puVar7 + 2) = 0;
                puVar7 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_a0,(ulong)(layerType->_M_dataplus)._M_p);
                local_80 = &local_70;
                plVar5 = puVar7 + 2;
                if ((long *)*puVar7 == plVar5) {
                  local_70 = *plVar5;
                  lStack_68 = puVar7[3];
                }
                else {
                  local_70 = *plVar5;
                  local_80 = (long *)*puVar7;
                }
                local_78 = puVar7[1];
                *puVar7 = plVar5;
                puVar7[1] = 0;
                *(undefined1 *)(puVar7 + 2) = 0;
                plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
                local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                psVar9 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar9) {
                  local_60.field_2._M_allocated_capacity = *psVar9;
                  local_60.field_2._8_8_ = plVar5[3];
                }
                else {
                  local_60.field_2._M_allocated_capacity = *psVar9;
                  local_60._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_60._M_string_length = plVar5[1];
                *plVar5 = (long)psVar9;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
              }
            }
            else {
              std::operator+(&local_40,"Layer \'",layerName);
              puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_40);
              local_a0 = &local_90;
              plVar5 = puVar7 + 2;
              if ((long *)*puVar7 == plVar5) {
                local_90 = *plVar5;
                lStack_88 = puVar7[3];
              }
              else {
                local_90 = *plVar5;
                local_a0 = (long *)*puVar7;
              }
              local_98 = puVar7[1];
              *puVar7 = plVar5;
              puVar7[1] = 0;
              *(undefined1 *)(puVar7 + 2) = 0;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_a0,(ulong)(layerType->_M_dataplus)._M_p);
              local_80 = &local_70;
              plVar5 = puVar7 + 2;
              if ((long *)*puVar7 == plVar5) {
                local_70 = *plVar5;
                lStack_68 = puVar7[3];
              }
              else {
                local_70 = *plVar5;
                local_80 = (long *)*puVar7;
              }
              local_78 = puVar7[1];
              *puVar7 = plVar5;
              puVar7[1] = 0;
              *(undefined1 *)(puVar7 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              psVar9 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_60.field_2._M_allocated_capacity = *psVar9;
                local_60.field_2._8_8_ = plVar5[3];
              }
              else {
                local_60.field_2._M_allocated_capacity = *psVar9;
                local_60._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_60._M_string_length = plVar5[1];
              *plVar5 = (long)psVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
            }
          }
          else {
            std::operator+(&local_40,"Layer \'",layerName);
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_40);
            local_a0 = &local_90;
            plVar5 = puVar7 + 2;
            if ((long *)*puVar7 == plVar5) {
              local_90 = *plVar5;
              lStack_88 = puVar7[3];
            }
            else {
              local_90 = *plVar5;
              local_a0 = (long *)*puVar7;
            }
            local_98 = puVar7[1];
            *puVar7 = plVar5;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_a0,(ulong)(layerType->_M_dataplus)._M_p);
            local_80 = &local_70;
            plVar5 = puVar7 + 2;
            if ((long *)*puVar7 == plVar5) {
              local_70 = *plVar5;
              lStack_68 = puVar7[3];
            }
            else {
              local_70 = *plVar5;
              local_80 = (long *)*puVar7;
            }
            local_78 = puVar7[1];
            *puVar7 = plVar5;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            psVar9 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_60.field_2._M_allocated_capacity = *psVar9;
              local_60.field_2._8_8_ = plVar5[3];
            }
            else {
              local_60.field_2._M_allocated_capacity = *psVar9;
              local_60._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_60._M_string_length = plVar5[1];
            *plVar5 = (long)psVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
          }
          goto LAB_00379c30;
        }
      }
    }
    else if ((lVar4 != 0) &&
            (weights == (WeightParams *)Specification::_WeightParams_default_instance_ ||
             weights->quantization_ == (QuantizationParams *)0x0)) goto LAB_00379cab;
  }
  std::operator+(&local_40,"Layer \'",layerName);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_a0 = &local_90;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_90 = *plVar8;
    lStack_88 = plVar5[3];
  }
  else {
    local_90 = *plVar8;
    local_a0 = (long *)*plVar5;
  }
  local_98 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_a0,(ulong)(layerType->_M_dataplus)._M_p);
  local_80 = &local_70;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_70 = *plVar8;
    lStack_68 = plVar5[3];
  }
  else {
    local_70 = *plVar8;
    local_80 = (long *)*plVar5;
  }
  local_78 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_60.field_2._M_allocated_capacity = *psVar9;
    local_60.field_2._8_8_ = plVar5[3];
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar9;
    local_60._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_60._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
LAB_00379c30:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateInt8Requirements(const Specification::WeightParams& weights,
                                           const std::string &layerType,
                                           const std::string &layerName) {
        if (CoreML::valueType(weights) != CoreML::QINT) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " :  \
                          when flag 'int8DynamicQuantize' is set to true, weights must be stored in the int8 format.");
        }

        if (weights.quantization().numberofbits() != 8) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " : \
                          Number of bits must equal 8 when flag 'int8DynamicQuantize' is set to true.");
        } else if (!weights.quantization().has_linearquantization()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " : \
                          Linear quantization must be used when flag 'int8DynamicQuantize' is set to true.");
        } else if (weights.quantization().linearquantization().scale_size() != 1) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " : \
                          Linear quantization scale must be size 1 when flag 'int8DynamicQuantize' is set to true.");
        } else if (weights.quantization().linearquantization().bias_size() != 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " : \
                          Linear quantization bias must be empty when flag 'int8DynamicQuantize' is set to true.");
        } else {
            return Result();
        }

    }